

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O2

size_t __thiscall cppurses::Text_display::first_index_at(Text_display *this,size_t line)

{
  const_reference pvVar1;
  ulong uVar2;
  
  uVar2 = (long)(this->display_state_).
                super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->display_state_).
                super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (uVar2 <= line) {
    line = uVar2 - 1;
  }
  pvVar1 = std::
           vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ::at(&this->display_state_,line);
  return pvVar1->start_index;
}

Assistant:

std::size_t Text_display::first_index_at(std::size_t line) const {
    if (line >= display_state_.size()) {
        line = display_state_.size() - 1;
    }
    return display_state_.at(line).start_index;
}